

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O0

QColor QColor::fromRgba(QRgb rgba)

{
  long lVar1;
  int b;
  int g;
  int r;
  QRgb in_EDI;
  long in_FS_OFFSET;
  QColor QVar2;
  int in_stack_ffffffffffffffb0;
  undefined8 local_28;
  undefined6 uStack_10;
  undefined2 uStack_a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  b = qRed(in_EDI);
  g = qGreen(in_EDI);
  r = qBlue(in_EDI);
  qAlpha(in_EDI);
  QVar2 = fromRgb(r,g,b,in_stack_ffffffffffffffb0);
  local_28 = QVar2._0_8_;
  uStack_10 = QVar2.ct._4_6_;
  QVar2._14_2_ = uStack_a;
  QVar2.ct._4_6_ = uStack_10;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._0_8_ = local_28;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QColor QColor::fromRgba(QRgb rgba) noexcept
{
    return fromRgb(qRed(rgba), qGreen(rgba), qBlue(rgba), qAlpha(rgba));
}